

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_base.cpp
# Opt level: O2

string * HexStr_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> s)

{
  long lVar1;
  pointer pcVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (__return_storage_ptr__,s.m_size * 2,'\0');
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (sVar3 = 0; s.m_size != sVar3; sVar3 = sVar3 + 1) {
    *(undefined2 *)pcVar2 = *(undefined2 *)HexStr::byte_to_hex._M_elems[s.m_data[sVar3]]._M_elems;
    pcVar2 = pcVar2 + 2;
  }
  if (pcVar2 == (__return_storage_ptr__->_M_dataplus)._M_p +
                __return_storage_ptr__->_M_string_length) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
    __stack_chk_fail();
  }
  __assert_fail("it == rv.data() + rv.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/hex_base.cpp"
                ,0x29,"std::string HexStr(const Span<const uint8_t>)");
}

Assistant:

std::string HexStr(const Span<const uint8_t> s)
{
    std::string rv(s.size() * 2, '\0');
    static constexpr auto byte_to_hex = CreateByteToHexMap();
    static_assert(sizeof(byte_to_hex) == 512);

    char* it = rv.data();
    for (uint8_t v : s) {
        std::memcpy(it, byte_to_hex[v].data(), 2);
        it += 2;
    }

    assert(it == rv.data() + rv.size());
    return rv;
}